

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgroup_controller.cpp
# Opt level: O2

ssize_t __thiscall
CgroupController::read(CgroupController *this,int __fd,void *__buf,size_t __nbytes)

{
  undefined4 in_register_00000034;
  path pStack_68;
  path local_40;
  
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (&local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__buf,
             auto_format);
  std::filesystem::__cxx11::operator/
            (&pStack_68,(path *)CONCAT44(in_register_00000034,__fd),&local_40);
  read_file((string *)this,&pStack_68);
  std::filesystem::__cxx11::path::~path(&pStack_68);
  std::filesystem::__cxx11::path::~path(&local_40);
  return (ssize_t)this;
}

Assistant:

std::string CgroupController::read(const std::string &filename) {
    return read_file(path_ / filename);
}